

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O1

void forbody(LexState *ls,int base,int line,int nvars,int isnum,Fornuminfo *info)

{
  FuncState *fs;
  int iVar1;
  int list;
  OpCode o;
  OpCode o_00;
  bool bVar2;
  BlockCnt bl;
  BlockCnt local_48;
  
  fs = ls->fs;
  adjustlocalvars(ls,3);
  checknext(ls,0x103);
  o = OP_FORPREP;
  o_00 = OP_FORLOOP;
  if (((isnum != 0) && ((ls->fs->f->ravi_jit).jit_flags = '\x01', info != (Fornuminfo *)0x0)) &&
     (bVar2 = info->is_constant != 0, bVar2)) {
    iVar1 = info->int_value;
    o_00 = OP_RAVI_FORLOOP_IP;
    if (iVar1 < 2) {
      o_00 = OP_FORLOOP;
    }
    o = OP_RAVI_FORPREP_IP;
    if (iVar1 < 2) {
      o = OP_FORPREP;
    }
    if (iVar1 < 2 && bVar2) {
      bVar2 = info->int_value == 1;
      o_00 = OP_FORLOOP;
      if (bVar2) {
        o_00 = OP_RAVI_FORLOOP_I1;
      }
      o = OP_FORPREP;
      if (bVar2) {
        o = OP_RAVI_FORPREP_I1;
      }
    }
  }
  if (isnum == 0) {
    iVar1 = luaK_jump(fs);
  }
  else {
    iVar1 = luaK_codeABx(fs,o,base,0x7fff);
  }
  enterblock(fs,&local_48,'\0');
  adjustlocalvars(ls,nvars);
  luaK_reserveregs(fs,nvars);
  block(ls);
  leaveblock(fs);
  luaK_patchtohere(fs,iVar1);
  if (isnum == 0) {
    luaK_codeABC(fs,OP_TFORCALL,base,0,nvars);
    luaK_fixline(fs,line);
    list = luaK_codeABx(fs,OP_TFORLOOP,base + 2,0x7fff);
  }
  else {
    list = luaK_codeABx(fs,o_00,base,0x7fff);
  }
  luaK_patchlist(fs,list,iVar1 + 1);
  luaK_fixline(fs,line);
  return;
}

Assistant:

static void forbody (LexState *ls, int base, int line, int nvars, int isnum, Fornuminfo *info) {
  /* forbody -> DO block */
  BlockCnt bl;
  OpCode forprep_inst = OP_FORPREP, forloop_inst = OP_FORLOOP;
  FuncState *fs = ls->fs;
  int prep, endfor;
  adjustlocalvars(ls, 3);  /* control variables */
  checknext(ls, TK_DO);
  if (isnum) {
    ls->fs->f->ravi_jit.jit_flags = RAVI_JIT_FLAG_HASFORLOOP;
    if (info && info->is_constant && info->int_value > 1) {
      forprep_inst = OP_RAVI_FORPREP_IP;
      forloop_inst = OP_RAVI_FORLOOP_IP;
    }
    else if (info && info->is_constant && info->int_value == 1) {
      forprep_inst = OP_RAVI_FORPREP_I1;
      forloop_inst = OP_RAVI_FORLOOP_I1;
    }
  }
  prep = isnum ? luaK_codeAsBx(fs, forprep_inst, base, NO_JUMP) : luaK_jump(fs);
  enterblock(fs, &bl, 0);  /* scope for declared variables */
  adjustlocalvars(ls, nvars);
  luaK_reserveregs(fs, nvars);
  block(ls);
  leaveblock(fs);  /* end of scope for declared variables */
  luaK_patchtohere(fs, prep);
  if (isnum)  /* numeric for? */
    endfor = luaK_codeAsBx(fs, forloop_inst, base, NO_JUMP);
  else {  /* generic for */
    luaK_codeABC(fs, OP_TFORCALL, base, 0, nvars);
    luaK_fixline(fs, line);
    endfor = luaK_codeAsBx(fs, OP_TFORLOOP, base + 2, NO_JUMP);
  }
  luaK_patchlist(fs, endfor, prep + 1);
  luaK_fixline(fs, line);
}